

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_raffects(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  long in_RDI;
  int i;
  bool found;
  char buf [4608];
  RUNE_DATA *rune;
  ROOM_AFFECT_DATA *paf;
  CHAR_DATA *in_stack_ffffffffffffed48;
  int in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed5c;
  char *in_stack_ffffffffffffed60;
  undefined8 local_1298;
  undefined8 local_1278;
  char *local_1260;
  char *local_1250;
  int local_1230;
  char local_1228 [4616];
  long local_20;
  undefined8 *local_18;
  long local_8;
  
  bVar3 = false;
  local_8 = in_RDI;
  if (*(long *)(*(long *)(in_RDI + 0xa8) + 0x160) != 0) {
    bVar3 = true;
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    for (local_18 = *(undefined8 **)(*(long *)(local_8 + 0xa8) + 0x160);
        local_18 != (undefined8 *)0x0; local_18 = (undefined8 *)*local_18) {
      if (*(int *)(local_18 + 6) == 0) {
        sprintf(local_1228,"Spell: \'%s\' ",skill_table[*(short *)((long)local_18 + 0x14)].name);
      }
      if (*(int *)(local_18 + 6) == 1) {
        sprintf(local_1228,"Skill: \'%s\' ",skill_table[*(short *)((long)local_18 + 0x14)].name);
      }
      if (*(int *)(local_18 + 6) == 2) {
        sprintf(local_1228,"Power: \'%s\' ",skill_table[*(short *)((long)local_18 + 0x14)].name);
      }
      if (*(int *)(local_18 + 6) == 4) {
        sprintf(local_1228,"Commune: \'%s\' ",skill_table[*(short *)((long)local_18 + 0x14)].name);
      }
      if ((((*(int *)(local_18 + 6) != 0) && (*(int *)(local_18 + 6) != 1)) &&
          (*(int *)(local_18 + 6) != 2)) &&
         ((*(int *)(local_18 + 6) != 3 && (*(int *)(local_18 + 6) != 4)))) {
        sprintf(local_1228,"Spell: \'%s\' ",skill_table[*(short *)((long)local_18 + 0x14)].name);
      }
      send_to_char(in_stack_ffffffffffffed60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
      pcVar4 = raffect_loc_name(in_stack_ffffffffffffed5c);
      if (*(short *)((long)local_18 + 0x12) == 2) {
        local_1250 = "flag";
      }
      else {
        local_1250 = "aff";
        if (*(short *)((long)local_18 + 0x12) == 1) {
          local_1250 = "const";
        }
      }
      if (local_18[1] == 0) {
        local_1260 = "none";
      }
      else {
        local_1260 = *(char **)(local_18[1] + 0xe8);
      }
      in_stack_ffffffffffffed58 = (int)*(short *)((long)local_18 + 0x16);
      in_stack_ffffffffffffed48 = (CHAR_DATA *)0x835322;
      sprintf(local_1228,"modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",
              pcVar4,(ulong)(uint)(int)*(short *)((long)local_18 + 0x1c),
              (ulong)(uint)((int)*(short *)(local_18 + 3) / 2),local_1250,"nullptr",local_1260);
      send_to_char(in_stack_ffffffffffffed60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    }
  }
  if ((*(byte *)(*(long *)(local_8 + 0xa8) + 0x1a8) & 1) != 0) {
    for (local_20 = *(long *)(*(long *)(local_8 + 0xa8) + 0x1a0); local_20 != 0;
        local_20 = *(long *)(local_20 + 0x40)) {
      pcVar4 = skill_table[*(int *)(local_20 + 0x28)].name;
      bVar2 = is_npc(in_stack_ffffffffffffed48);
      if (bVar2) {
        local_1278 = *(undefined8 *)(*(long *)(local_20 + 0x10) + 0xe8);
      }
      else {
        local_1278 = *(undefined8 *)(*(long *)(local_20 + 0x10) + 0xf0);
      }
      sprintf(local_1228,"Rune \'%s\' placed in room by %s, level %d, duration %d hours.\n\r",pcVar4
              ,local_1278,(ulong)*(uint *)(local_20 + 0x20),(ulong)*(uint *)(local_20 + 0x24));
      send_to_char(in_stack_ffffffffffffed60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    }
  }
  for (local_1230 = 0; local_1230 < 6; local_1230 = local_1230 + 1) {
    if ((*(long *)(*(long *)(local_8 + 0xa8) + 0x38 + (long)local_1230 * 8) != 0) &&
       ((*(byte *)(*(long *)(*(long *)(local_8 + 0xa8) + 0x38 + (long)local_1230 * 8) + 0x48) & 1)
        == 1)) {
      local_20 = *(long *)(*(long *)(*(long *)(local_8 + 0xa8) + 0x38 + (long)local_1230 * 8) + 0x40
                          );
      pcVar4 = skill_table[*(int *)(local_20 + 0x28)].name;
      pcVar1 = direction_table[local_1230].name;
      bVar3 = is_npc(in_stack_ffffffffffffed48);
      if (bVar3) {
        local_1298 = *(undefined8 *)(*(long *)(local_20 + 0x10) + 0xe8);
      }
      else {
        local_1298 = *(undefined8 *)(*(long *)(local_20 + 0x10) + 0xf0);
      }
      in_stack_ffffffffffffed48 =
           (CHAR_DATA *)
           CONCAT44((int)((ulong)in_stack_ffffffffffffed48 >> 0x20),*(undefined4 *)(local_20 + 0x24)
                   );
      sprintf(local_1228,"Rune \'%s\' placed on %s door by %s, level %d, duration %d hours.\n\r",
              pcVar4,pcVar1,local_1298,(ulong)*(uint *)(local_20 + 0x20));
      send_to_char(in_stack_ffffffffffffed60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
      bVar3 = true;
    }
  }
  if (!bVar3) {
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
  }
  return;
}

Assistant:

void do_raffects(CHAR_DATA *ch, char *argument)
{
	ROOM_AFFECT_DATA *paf;
	RUNE_DATA *rune;
	char buf[MAX_STRING_LENGTH];
	bool found = false;
	int i = 0;

	if (ch->in_room->affected != nullptr)
	{
		found = true;
		send_to_char("The room is affected by:\n\r", ch);

		for (paf = ch->in_room->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->aftype == AFT_SPELL)
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: '%s' ", skill_table[paf->type].name);

			if (paf->aftype != AFT_SPELL && paf->aftype != AFT_SKILL && paf->aftype != AFT_POWER &&
				paf->aftype != AFT_MALADY && paf->aftype != AFT_COMMUNE)
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);
			send_to_char(buf, ch);

			sprintf(buf, "modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",
				raffect_loc_name(paf->location),
				paf->modifier,
				paf->duration / 2,
				paf->where == TO_ROOM_FLAGS ? "flag" : paf->where == TO_ROOM_CONST ? "const" : "aff",
				"nullptr",
				paf->owner != nullptr ? paf->owner->name : "none",
				paf->level);
			send_to_char(buf, ch);
		}
	}

	if (ch->in_room->has_rune)
	{
		for (rune = ch->in_room->rune; rune; rune = rune->next_content)
		{
			sprintf(buf, "Rune '%s' placed in room by %s, level %d, duration %d hours.\n\r",
				skill_table[rune->type].name,
				!is_npc(rune->owner) ? rune->owner->true_name : rune->owner->name,
				rune->level,
				rune->duration);
			send_to_char(buf, ch);
		}
	}

	for (i = 0; i < 6; i++)
	{
		if (ch->in_room->exit[i] && ch->in_room->exit[i]->has_rune == true)
		{
			rune = ch->in_room->exit[i]->rune;

			sprintf(buf, "Rune '%s' placed on %s door by %s, level %d, duration %d hours.\n\r",
				skill_table[rune->type].name,
				direction_table[i].name,
				!is_npc(rune->owner) ? rune->owner->true_name : rune->owner->name,
				rune->level, rune->duration);
			send_to_char(buf, ch);

			found = true;
		}
	}

	if (!found)
		send_to_char("The room is not affected by anything.\n\r", ch);
}